

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  int iVar1;
  XmlWriter *this_00;
  IConfig *pIVar2;
  long in_RDI;
  TestCaseInfo *in_stack_ffffffffffffff68;
  allocator *paVar3;
  StreamingReporterBase *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [40];
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  XmlWriter *in_stack_ffffffffffffffd0;
  
  StreamingReporterBase::testCaseStarting(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd0,"TestCase",(allocator *)&stack0xffffffffffffffcf);
  this_00 = XmlWriter::startElement
                      ((XmlWriter *)in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->name);
  paVar3 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"name",paVar3);
  XmlWriter::writeAttribute
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  pIVar2 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)(in_RDI + 0x10));
  iVar1 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
  if (iVar1 == 1) {
    Timer::start((Timer *)this_00);
  }
  return;
}

Assistant:

virtual void testCaseStarting( TestCaseInfo const& testInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testCaseStarting(testInfo);
            m_xml.startElement( "TestCase" ).writeAttribute( "name", testInfo.name );

            if ( m_config->showDurations() == ShowDurations::Always )
                m_testCaseTimer.start();
        }